

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

string * spirv_cross::convert_to_string
                   (string *__return_storage_ptr__,int64_t value,string *int64_type,
                   bool long_long_literal_suffix)

{
  long lVar1;
  char *__rhs;
  char (*in_R9) [2];
  string local_50;
  char *local_30;
  byte local_21;
  string *psStack_20;
  bool long_long_literal_suffix_local;
  string *int64_type_local;
  int64_t value_local;
  
  local_21 = long_long_literal_suffix;
  psStack_20 = int64_type;
  int64_type_local = (string *)value;
  value_local = (int64_t)__return_storage_ptr__;
  lVar1 = ::std::numeric_limits<long>::min();
  if (value == lVar1) {
    local_30 = "l";
    if ((local_21 & 1) != 0) {
      local_30 = "ll";
    }
    join<std::__cxx11::string_const&,char_const(&)[21],char_const*,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)psStack_20,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "(0x8000000000000000u",(char (*) [21])&local_30,(char **)0x682405,in_R9);
  }
  else {
    ::std::__cxx11::to_string(&local_50,(long)int64_type_local);
    __rhs = "l";
    if ((local_21 & 1) != 0) {
      __rhs = "ll";
    }
    ::std::operator+(__return_storage_ptr__,&local_50,__rhs);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline std::string convert_to_string(int64_t value, const std::string &int64_type, bool long_long_literal_suffix)
{
	// INT64_MIN is ... special on some backends.
	// If we use a decimal literal, and negate it, we might overflow the representable numbers.
	// To workaround it, emit int(0x80000000) instead.
	if (value == (std::numeric_limits<int64_t>::min)())
		return join(int64_type, "(0x8000000000000000u", (long_long_literal_suffix ? "ll" : "l"), ")");
	else
		return std::to_string(value) + (long_long_literal_suffix ? "ll" : "l");
}